

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CThumbInstruction.cpp
# Opt level: O2

void __thiscall
CThumbInstruction::CThumbInstruction
          (CThumbInstruction *this,tThumbOpcode *sourceOpcode,ThumbOpcodeVariables *vars)

{
  char *pcVar1;
  undefined2 uVar2;
  int iVar3;
  
  ArmOpcodeCommand::ArmOpcodeCommand(&this->super_ArmOpcodeCommand);
  (this->super_ArmOpcodeCommand).super_CAssemblerCommand._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CThumbInstruction_001b5540;
  ThumbOpcodeVariables::ThumbOpcodeVariables(&this->Vars);
  uVar2 = *(undefined2 *)&sourceOpcode->field_0x12;
  iVar3 = sourceOpcode->flags;
  (this->Opcode).encoding = sourceOpcode->encoding;
  *(undefined2 *)&(this->Opcode).field_0x12 = uVar2;
  (this->Opcode).flags = iVar3;
  pcVar1 = sourceOpcode->mask;
  (this->Opcode).name = sourceOpcode->name;
  (this->Opcode).mask = pcVar1;
  ThumbOpcodeVariables::operator=(&this->Vars,vars);
  this->OpcodeSize = (ulong)((uint)(this->Opcode).flags >> 0xb & 2) + 2;
  return;
}

Assistant:

CThumbInstruction::CThumbInstruction(const tThumbOpcode& sourceOpcode, ThumbOpcodeVariables& vars)
{
	this->Opcode = sourceOpcode;
	this->Vars = vars;
	
	OpcodeSize = Opcode.flags & THUMB_LONG ? 4 : 2;
}